

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
CoreML::LinearModel::getOffsets
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,LinearModel *this)

{
  element_type *this_00;
  double local_58;
  double n;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedField<double> *__range1;
  GLMRegressor *local_28;
  GLMRegressor *lr;
  LinearModel *local_18;
  LinearModel *this_local;
  vector<double,_std::allocator<double>_> *result;
  
  lr._7_1_ = 0;
  local_18 = this;
  this_local = (LinearModel *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  local_28 = Specification::Model::mutable_glmregressor(this_00);
  __begin1 = (const_iterator)Specification::GLMRegressor::offset(local_28);
  __end1 = google::protobuf::RepeatedField<double>::begin((RepeatedField<double> *)__begin1);
  n = (double)google::protobuf::RepeatedField<double>::end((RepeatedField<double> *)__begin1);
  for (; __end1 != (const_iterator)n; __end1 = __end1 + 1) {
    local_58 = *__end1;
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> LinearModel::getOffsets() {
        std::vector<double> result;
        auto lr = m_spec->mutable_glmregressor();
        for(double n : lr->offset()) {
            result.push_back(n);
        }
        return result;
    }